

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O2

void __thiscall
google::protobuf::internal::EpsCopyInputStream::BackUp(EpsCopyInputStream *this,char *ptr)

{
  char *pcVar1;
  int count;
  LogMessageFatal aLStack_18 [16];
  
  pcVar1 = this->buffer_end_ + 0x10;
  if (pcVar1 < ptr) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (aLStack_18,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/parse_context.h"
               ,0x67,0x1f,"ptr <= buffer_end_ + kSlopBytes");
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_18);
  }
  count = ((int)this->buffer_end_ - (int)ptr) + this->size_;
  if (this->next_chunk_ == this->patch_buffer_) {
    count = (int)pcVar1 - (int)ptr;
  }
  if (0 < count) {
    StreamBackUp(this,count);
    return;
  }
  return;
}

Assistant:

void BackUp(const char* ptr) {
    ABSL_DCHECK(ptr <= buffer_end_ + kSlopBytes);
    int count;
    if (next_chunk_ == patch_buffer_) {
      count = static_cast<int>(buffer_end_ + kSlopBytes - ptr);
    } else {
      count = size_ + static_cast<int>(buffer_end_ - ptr);
    }
    if (count > 0) StreamBackUp(count);
  }